

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbtConvexHullShape::localGetSupportingVertexWithoutMargin(cbtConvexHullShape *this,cbtVector3 *vec)

{
  undefined1 *v2;
  long lVar1;
  undefined1 auVar7 [12];
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [56];
  undefined8 uVar8;
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [56];
  cbtVector3 cVar6;
  cbtScalar maxDot;
  cbtVector3 scaled;
  cbtScalar local_24;
  cbtVector3 local_20;
  undefined1 auVar2 [64];
  undefined1 auVar4 [64];
  
  auVar5 = in_ZMM1._8_56_;
  auVar3 = in_ZMM0._8_56_;
  local_24 = -1e+18;
  if ((this->m_unscaledPoints).m_size < 1) {
    cVar6.m_floats = (cbtScalar  [4])(ZEXT816(0) << 0x40);
  }
  else {
    v2 = &(this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
          super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.field_0x1c;
    cVar6 = ::operator*(vec,(cbtVector3 *)v2);
    auVar4._0_8_ = cVar6.m_floats._8_8_;
    auVar4._8_56_ = auVar5;
    auVar2._0_8_ = cVar6.m_floats._0_8_;
    auVar2._8_56_ = auVar3;
    local_20.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar2._0_16_,auVar4._0_16_);
    lVar1 = cbtVector3::maxDot(&local_20,(this->m_unscaledPoints).m_data,
                               (long)(this->m_unscaledPoints).m_size,&local_24);
    cVar6 = ::operator*((this->m_unscaledPoints).m_data + (int)lVar1,(cbtVector3 *)v2);
  }
  cVar6.m_floats[0] = cVar6.m_floats[0];
  auVar7._4_4_ = cVar6.m_floats[1];
  register0x00001240 = cVar6.m_floats[2];
  register0x00001244 = cVar6.m_floats[3];
  return (cbtVector3)cVar6.m_floats;
}

Assistant:

cbtVector3 cbtConvexHullShape::localGetSupportingVertexWithoutMargin(const cbtVector3& vec) const
{
	cbtVector3 supVec(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	cbtScalar maxDot = cbtScalar(-BT_LARGE_FLOAT);

	// Here we take advantage of dot(a, b*c) = dot(a*b, c).  Note: This is true mathematically, but not numerically.
	if (0 < m_unscaledPoints.size())
	{
		cbtVector3 scaled = vec * m_localScaling;
		int index = (int)scaled.maxDot(&m_unscaledPoints[0], m_unscaledPoints.size(), maxDot);  // FIXME: may violate encapsulation of m_unscaledPoints
		return m_unscaledPoints[index] * m_localScaling;
	}

	return supVec;
}